

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall IteratorTest::comparisonOperators<true>(IteratorTest *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t sVar1;
  size_t sVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar7;
  logic_error *plVar8;
  runtime_error *prVar9;
  code *pcVar10;
  int iVar11;
  undefined *puVar12;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it2;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1c8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_198;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_168;
  undefined1 local_130 [16];
  size_t *local_120;
  size_t local_108;
  size_t local_100;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_f0;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_c0;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_90;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_60;
  
  _Var6._M_current = (unsigned_long *)operator_new(8);
  *_Var6._M_current = 0x18;
  local_130._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),_Var6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var6._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_198);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
  local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.index_ = 0;
  local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.view_ = (view_pointer)0x0;
  local_198.pointer_ = (pointer)0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_198);
  local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.index_ = 0;
  local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.view_ = (view_pointer)0x0;
  local_168.pointer_ = (pointer)0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_168);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1c8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
  puVar4 = local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar3 = local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_198.view_ = local_1c8.view_;
  local_198.pointer_ = local_1c8.pointer_;
  local_198.index_ = local_1c8.index_;
  local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  if (local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1c8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
  puVar4 = local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar3 = local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_168.view_ = local_1c8.view_;
  local_168.pointer_ = local_1c8.pointer_;
  local_168.index_ = local_1c8.index_;
  local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  if (local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar11 = 0x18;
  do {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_198);
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  if (local_198.view_ == (view_pointer)0x0) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  else {
    if (local_168.view_ != (view_pointer)0x0) {
      if (local_198.index_ - local_168.index_ != 0x18) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        pcVar10 = std::logic_error::~logic_error;
        puVar12 = &std::logic_error::typeinfo;
        goto LAB_001d0c96;
      }
      iVar11 = 0x18;
      do {
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_168);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      if (local_198.view_ == (view_pointer)0x0) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      }
      else {
        if (local_168.view_ != (view_pointer)0x0) {
          if (local_198.index_ != local_168.index_) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar10 = std::logic_error::~logic_error;
            puVar12 = &std::logic_error::typeinfo;
            goto LAB_001d0d12;
          }
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    (&local_1c8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
          puVar4 = local_198.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar3 = local_198.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_198.view_ = local_1c8.view_;
          local_198.pointer_ = local_1c8.pointer_;
          local_198.index_ = local_1c8.index_;
          local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_1c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_198.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar3 != (pointer)0x0) {
            operator_delete(puVar3,(long)puVar4 - (long)puVar3);
          }
          if (local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                    (&local_1c8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
          puVar4 = local_168.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar3 = local_168.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_168.view_ = local_1c8.view_;
          local_168.pointer_ = local_1c8.pointer_;
          local_168.index_ = local_1c8.index_;
          local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_1c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_168.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1c8.coordinates_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar3 != (pointer)0x0) {
            operator_delete(puVar3,(long)puVar4 - (long)puVar3);
          }
          if (local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          iVar11 = 0x18;
          do {
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_168);
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          if (local_198.view_ == (view_pointer)0x0) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          }
          else {
            if (local_168.view_ != (view_pointer)0x0) {
              if (local_198.index_ - local_168.index_ != -0x18) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar8,"test failed.");
                pcVar10 = std::logic_error::~logic_error;
                puVar12 = &std::logic_error::typeinfo;
                goto LAB_001d0d8e;
              }
              if (local_168.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_198.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_198.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_120,local_108 * 0x18);
              operator_delete(_Var6._M_current,8);
              _Var6._M_current = (unsigned_long *)operator_new(8);
              *_Var6._M_current = 0x18;
              local_130._0_8_ = this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),_Var6,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var6._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_198);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
              local_198.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_198.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_198.index_ = 0;
              local_198.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_198.view_ = (view_pointer)0x0;
              local_198.pointer_ = (pointer)0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_198)
              ;
              local_168.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_168.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_168.index_ = 0;
              local_168.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_168.view_ = (view_pointer)0x0;
              local_168.pointer_ = (pointer)0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_168)
              ;
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        (&local_1c8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
              puVar4 = local_198.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              puVar3 = local_198.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_198.view_ = local_1c8.view_;
              local_198.pointer_ = local_1c8.pointer_;
              local_198.index_ = local_1c8.index_;
              local_198.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_1c8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_198.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1c8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_198.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_1c8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar3 != (pointer)0x0) {
                operator_delete(puVar3,(long)puVar4 - (long)puVar3);
              }
              if (local_1c8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1c8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                        (&local_1c8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
              puVar4 = local_168.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              puVar3 = local_168.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_168.view_ = local_1c8.view_;
              local_168.pointer_ = local_1c8.pointer_;
              local_168.index_ = local_1c8.index_;
              local_168.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_1c8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_168.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1c8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_168.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_1c8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1c8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar3 != (pointer)0x0) {
                operator_delete(puVar3,(long)puVar4 - (long)puVar3);
              }
              if (local_1c8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1c8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              iVar11 = 0x18;
              do {
                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_198);
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
              if (local_198.view_ == (view_pointer)0x0) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
              else {
                if (local_168.view_ != (view_pointer)0x0) {
                  if (local_198.index_ - local_168.index_ != 0x18) {
                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar8,"test failed.");
                    pcVar10 = std::logic_error::~logic_error;
                    puVar12 = &std::logic_error::typeinfo;
                    goto LAB_001d0e0a;
                  }
                  iVar11 = 0x18;
                  do {
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                              (&local_168);
                    iVar11 = iVar11 + -1;
                  } while (iVar11 != 0);
                  if (local_198.view_ == (view_pointer)0x0) {
                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  }
                  else {
                    if (local_168.view_ != (view_pointer)0x0) {
                      if (local_198.index_ != local_168.index_) {
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar8,"test failed.");
                        pcVar10 = std::logic_error::~logic_error;
                        puVar12 = &std::logic_error::typeinfo;
                        goto LAB_001d0e86;
                      }
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                (&local_1c8,
                                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
                      puVar4 = local_198.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                      puVar3 = local_198.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_198.view_ = local_1c8.view_;
                      local_198.pointer_ = local_1c8.pointer_;
                      local_198.index_ = local_1c8.index_;
                      local_198.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           local_1c8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_198.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_1c8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                      local_198.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           local_1c8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                      local_1c8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1c8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1c8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      if (puVar3 != (pointer)0x0) {
                        operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                      }
                      if (local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_1c8.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_1c8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_1c8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_130);
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                (&local_1c8,
                                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_130,0);
                      puVar4 = local_168.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                      puVar3 = local_168.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_168.view_ = local_1c8.view_;
                      local_168.pointer_ = local_1c8.pointer_;
                      local_168.index_ = local_1c8.index_;
                      local_168.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           local_1c8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_168.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_1c8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                      local_168.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           local_1c8.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                      local_1c8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1c8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1c8.coordinates_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      if (puVar3 != (pointer)0x0) {
                        operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                      }
                      if (local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_1c8.coordinates_.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_1c8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_1c8.coordinates_.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      iVar11 = 0x18;
                      do {
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                  (&local_168);
                        iVar11 = iVar11 + -1;
                      } while (iVar11 != 0);
                      if (local_198.view_ == (view_pointer)0x0) {
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar8,"Assertion failed.");
                      }
                      else {
                        if (local_168.view_ != (view_pointer)0x0) {
                          if (local_198.index_ - local_168.index_ != -0x18) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar8,"test failed.");
                            pcVar10 = std::logic_error::~logic_error;
                            puVar12 = &std::logic_error::typeinfo;
                            goto LAB_001d0f02;
                          }
                          if (local_168.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_168.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_198.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_198.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_120,local_108 * 0x18);
                          operator_delete(_Var6._M_current,8);
                          _Var6._M_current = (unsigned_long *)operator_new(8);
                          *_Var6._M_current = 0x18;
                          local_130._0_8_ = this;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),
                                     _Var6,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                            )(_Var6._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_198);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
                          local_198.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_198.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_198.index_ = 0;
                          local_198.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_198.view_ = (view_pointer)0x0;
                          local_198.pointer_ = (pointer)0x0;
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_198);
                          local_168.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_168.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_168.index_ = 0;
                          local_168.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_168.view_ = (view_pointer)0x0;
                          local_168.pointer_ = (pointer)0x0;
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_168);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_c0,
                                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_130,0
                                    );
                          this_00 = &local_1c8.coordinates_;
                          local_1c8.view_ = (view_pointer)local_c0.view_;
                          local_1c8.pointer_ = local_c0.pointer_;
                          local_1c8.index_ = local_c0.index_;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    (this_00,&local_c0.coordinates_);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_1c8);
                          puVar4 = local_198.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          puVar3 = local_198.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          local_198.view_ = local_1c8.view_;
                          local_198.pointer_ = local_1c8.pointer_;
                          local_198.index_ = local_1c8.index_;
                          local_198.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               local_1c8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                          local_198.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_1c8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          local_198.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage =
                               local_1c8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                          local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          if (puVar3 != (pointer)0x0) {
                            operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                          }
                          if (local_1c8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_1c8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_c0.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_c0.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_c0.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_c0.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
                          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_c0,
                                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_130,0
                                    );
                          local_1c8.view_ = (view_pointer)local_c0.view_;
                          local_1c8.pointer_ = local_c0.pointer_;
                          local_1c8.index_ = local_c0.index_;
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                    (this_00,&local_c0.coordinates_);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_1c8);
                          puVar4 = local_168.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          puVar3 = local_168.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          local_168.view_ = local_1c8.view_;
                          local_168.pointer_ = local_1c8.pointer_;
                          local_168.index_ = local_1c8.index_;
                          local_168.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               local_1c8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                          local_168.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_1c8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          local_168.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage =
                               local_1c8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                          local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_1c8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          if (puVar3 != (pointer)0x0) {
                            operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                          }
                          if (local_1c8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_1c8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_c0.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_c0.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_c0.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_c0.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          iVar11 = 0x18;
                          do {
                            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                      (&local_198);
                            iVar11 = iVar11 + -1;
                          } while (iVar11 != 0);
                          if (local_198.view_ == (view_pointer)0x0) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                          }
                          else {
                            if (local_168.view_ != (view_pointer)0x0) {
                              if (local_198.index_ - local_168.index_ != 0x18) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar8,"test failed.");
                                pcVar10 = std::logic_error::~logic_error;
                                puVar12 = &std::logic_error::typeinfo;
                                goto LAB_001d0f7e;
                              }
                              iVar11 = 0x18;
                              do {
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                operator++(&local_168);
                                iVar11 = iVar11 + -1;
                              } while (iVar11 != 0);
                              if (local_198.view_ == (view_pointer)0x0) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar8,"Assertion failed.");
                              }
                              else {
                                if (local_168.view_ != (view_pointer)0x0) {
                                  if (local_198.index_ != local_168.index_) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar8,"test failed.");
                                    pcVar10 = std::logic_error::~logic_error;
                                    puVar12 = &std::logic_error::typeinfo;
                                    goto LAB_001d0ffa;
                                  }
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_130);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator(&local_c0,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_130,0);
                                  local_1c8.view_ = (view_pointer)local_c0.view_;
                                  local_1c8.pointer_ = local_c0.pointer_;
                                  local_1c8.index_ = local_c0.index_;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            (this_00,&local_c0.coordinates_);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_1c8);
                                  puVar4 = local_198.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  puVar3 = local_198.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  local_198.view_ = local_1c8.view_;
                                  local_198.pointer_ = local_1c8.pointer_;
                                  local_198.index_ = local_1c8.index_;
                                  local_198.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start =
                                       local_1c8.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                                  local_198.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_1c8.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                                  local_198.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                                       local_1c8.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if (puVar3 != (pointer)0x0) {
                                    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                  }
                                  if (local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_1c8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (local_c0.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_c0.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_c0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_c0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_130);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator(&local_c0,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_130,0);
                                  local_1c8.view_ = (view_pointer)local_c0.view_;
                                  local_1c8.pointer_ = local_c0.pointer_;
                                  local_1c8.index_ = local_c0.index_;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            (this_00,&local_c0.coordinates_);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_1c8);
                                  puVar4 = local_168.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  puVar3 = local_168.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  local_168.view_ = local_1c8.view_;
                                  local_168.pointer_ = local_1c8.pointer_;
                                  local_168.index_ = local_1c8.index_;
                                  local_168.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start =
                                       local_1c8.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                                  local_168.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_1c8.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                                  local_168.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                                       local_1c8.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_1c8.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if (puVar3 != (pointer)0x0) {
                                    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                  }
                                  if (local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_1c8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if (local_c0.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_c0.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_c0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_c0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  iVar11 = 0x18;
                                  do {
                                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                    operator++(&local_168);
                                    iVar11 = iVar11 + -1;
                                  } while (iVar11 != 0);
                                  if (local_198.view_ == (view_pointer)0x0) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                  }
                                  else {
                                    if (local_168.view_ != (view_pointer)0x0) {
                                      if (local_198.index_ - local_168.index_ != -0x18) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar8,"test failed.");
                                        pcVar10 = std::logic_error::~logic_error;
                                        puVar12 = &std::logic_error::typeinfo;
                                        goto LAB_001d1076;
                                      }
                                      if (local_168.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      if (local_198.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      operator_delete(local_120,local_108 * 0x18);
                                      operator_delete(_Var6._M_current,8);
                                      _Var6._M_current = (unsigned_long *)operator_new(8);
                                      *_Var6._M_current = 0x18;
                                      local_130._0_8_ = this;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_130 + 8),_Var6,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_198)
                                      ;
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_130);
                                      local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      local_198.index_ = 0;
                                      local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_198.view_ = (view_pointer)0x0;
                                      local_198.pointer_ = (pointer)0x0;
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_198);
                                      local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      local_168.index_ = 0;
                                      local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_168.view_ = (view_pointer)0x0;
                                      local_168.pointer_ = (pointer)0x0;
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_168);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_130);
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1c8,
                                               (View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_130,0);
                                      puVar4 = local_198.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      puVar3 = local_198.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                      local_198.view_ = local_1c8.view_;
                                      local_198.pointer_ = local_1c8.pointer_;
                                      local_198.index_ = local_1c8.index_;
                                      local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           local_1c8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                      local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           local_1c8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                                      local_198.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           local_1c8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      if (puVar3 != (pointer)0x0) {
                                        operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                      }
                                      if (local_1c8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_130);
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1c8,
                                               (View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_130,0);
                                      puVar4 = local_168.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      puVar3 = local_168.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                      local_168.view_ = local_1c8.view_;
                                      local_168.pointer_ = local_1c8.pointer_;
                                      local_168.index_ = local_1c8.index_;
                                      local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           local_1c8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                      local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           local_1c8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                                      local_168.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           local_1c8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_1c8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      if (puVar3 != (pointer)0x0) {
                                        operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                      }
                                      if (local_1c8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      iVar11 = 0x18;
                                      do {
                                        if (local_198.view_ == (view_pointer)0x0) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar8,"Assertion failed.");
LAB_001cffbc:
                                          pcVar10 = std::runtime_error::~runtime_error;
                                          puVar12 = &std::runtime_error::typeinfo;
LAB_001cffca:
                                          __cxa_throw(plVar8,puVar12,pcVar10);
                                        }
                                        if (local_168.view_ != local_198.view_) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar8,"Assertion failed.");
                                          goto LAB_001cffbc;
                                        }
                                        if (local_198.index_ != local_168.index_) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar8,"test failed.");
                                          pcVar10 = std::logic_error::~logic_error;
                                          puVar12 = &std::logic_error::typeinfo;
                                          goto LAB_001cffca;
                                        }
                                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>
                                        ::operator++(&local_198);
                                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>
                                        ::operator++(&local_168);
                                        iVar11 = iVar11 + -1;
                                      } while (iVar11 != 0);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_130);
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1c8,
                                               (View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_130,local_100);
                                      sVar2 = local_198.index_;
                                      sVar1 = local_1c8.index_;
                                      if (local_198.view_ == (view_pointer)0x0) {
                                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar9,"Assertion failed.");
LAB_001d10b8:
                                        __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      if (local_1c8.view_ != local_198.view_) {
                                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar9,"Assertion failed.");
                                        goto LAB_001d10b8;
                                      }
                                      if (local_198.index_ != local_1c8.index_) {
LAB_001d0a18:
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar8,"test failed.");
                                        __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                    std::logic_error::~logic_error);
                                      }
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_130);
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      Iterator((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                *)&local_c0,
                                               (View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_130,local_100);
                                      if (local_168.view_ == (view_pointer)0x0) {
                                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar9,"Assertion failed.");
LAB_001d1108:
                                        __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      if (local_c0.view_ != (view_pointer)local_168.view_) {
                                        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  (prVar9,"Assertion failed.");
                                        goto LAB_001d1108;
                                      }
                                      if (local_168.index_ != local_c0.index_) goto LAB_001d0a18;
                                      if ((sVar2 == sVar1) &&
                                         (local_c0.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                         ) {
                                        operator_delete(local_c0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_c0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_c0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      if (local_1c8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      pIVar7 = andres::
                                               Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                               operator--(&local_198);
                                      if ((pIVar7->view_ == (view_pointer)0x0) ||
                                         ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar8,"Assertion failed.");
LAB_001d0ab0:
                                        pcVar10 = std::runtime_error::~runtime_error;
                                        puVar12 = &std::runtime_error::typeinfo;
                                      }
                                      else {
                                        if (*pIVar7->pointer_ == 0x2e) {
                                          pIVar7 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_168);
                                          if ((pIVar7->view_ == (view_pointer)0x0) ||
                                             ((pIVar7->view_->geometry_).size_ <= pIVar7->index_)) {
                                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar8,"Assertion failed.");
                                            goto LAB_001d0ab0;
                                          }
                                          if (*pIVar7->pointer_ == 0x2e) {
                                            if (local_168.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_168.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            if (local_198.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_198.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            operator_delete(local_120,local_108 * 0x18);
                                            operator_delete(_Var6._M_current,8);
                                            _Var6._M_current = (unsigned_long *)operator_new(8);
                                            *_Var6._M_current = 0x18;
                                            local_130._0_8_ = this;
                                            andres::marray_detail::
                                            Geometry<std::allocator<unsigned_long>>::
                                            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                      ((Geometry<std::allocator<unsigned_long>> *)
                                                       (local_130 + 8),_Var6,
                                                       (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                            local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            local_198.index_ = 0;
                                            local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_198.view_ = (view_pointer)0x0;
                                            local_198.pointer_ = (pointer)0x0;
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            testInvariant(&local_198);
                                            local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            local_168.index_ = 0;
                                            local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_168.view_ = (view_pointer)0x0;
                                            local_168.pointer_ = (pointer)0x0;
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            testInvariant(&local_168);
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator(&local_1c8,
                                                     (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                            puVar4 = local_198.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ;
                                            puVar3 = local_198.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                            local_198.view_ = local_1c8.view_;
                                            local_198.pointer_ = local_1c8.pointer_;
                                            local_198.index_ = local_1c8.index_;
                                            local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start =
                                                 local_1c8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                                            local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 local_1c8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish;
                                            local_198.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 local_1c8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                            local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            if (puVar3 != (pointer)0x0) {
                                              operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                            }
                                            if (local_1c8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_1c8.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator(&local_1c8,
                                                     (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                            puVar4 = local_168.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ;
                                            puVar3 = local_168.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                            local_168.view_ = local_1c8.view_;
                                            local_168.pointer_ = local_1c8.pointer_;
                                            local_168.index_ = local_1c8.index_;
                                            local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start =
                                                 local_1c8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                                            local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 local_1c8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish;
                                            local_168.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 local_1c8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                            local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_1c8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            if (puVar3 != (pointer)0x0) {
                                              operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                                            }
                                            if (local_1c8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_1c8.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            iVar11 = 0x18;
                                            do {
                                              if (local_198.view_ == (view_pointer)0x0) {
                                                plVar8 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar8,
                                                           "Assertion failed.");
LAB_001d0038:
                                                pcVar10 = std::runtime_error::~runtime_error;
                                                puVar12 = &std::runtime_error::typeinfo;
LAB_001d0046:
                                                __cxa_throw(plVar8,puVar12,pcVar10);
                                              }
                                              if (local_168.view_ != local_198.view_) {
                                                plVar8 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar8,
                                                           "Assertion failed.");
                                                goto LAB_001d0038;
                                              }
                                              if (local_198.index_ != local_168.index_) {
                                                plVar8 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar8,"test failed.")
                                                ;
                                                pcVar10 = std::logic_error::~logic_error;
                                                puVar12 = &std::logic_error::typeinfo;
                                                goto LAB_001d0046;
                                              }
                                              andres::
                                              Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                              operator++(&local_198);
                                              andres::
                                              Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                              operator++(&local_168);
                                              iVar11 = iVar11 + -1;
                                            } while (iVar11 != 0);
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator(&local_1c8,
                                                     (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,local_100);
                                            sVar2 = local_198.index_;
                                            sVar1 = local_1c8.index_;
                                            if (local_198.view_ == (view_pointer)0x0) {
                                              prVar9 = (runtime_error *)
                                                       __cxa_allocate_exception(0x10);
                                              std::runtime_error::runtime_error
                                                        (prVar9,"Assertion failed.");
LAB_001d115b:
                                              __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                                          std::runtime_error::~runtime_error);
                                            }
                                            if (local_1c8.view_ != local_198.view_) {
                                              prVar9 = (runtime_error *)
                                                       __cxa_allocate_exception(0x10);
                                              std::runtime_error::runtime_error
                                                        (prVar9,"Assertion failed.");
                                              goto LAB_001d115b;
                                            }
                                            if (local_198.index_ != local_1c8.index_) {
LAB_001d0ac6:
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar8,"test failed.");
                                              __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                          std::logic_error::~logic_error);
                                            }
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator(&local_60,
                                                     (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,local_100);
                                            if (local_168.view_ == (view_pointer)0x0) {
                                              prVar9 = (runtime_error *)
                                                       __cxa_allocate_exception(0x10);
                                              std::runtime_error::runtime_error
                                                        (prVar9,"Assertion failed.");
LAB_001d11ab:
                                              __cxa_throw(prVar9,&std::runtime_error::typeinfo,
                                                          std::runtime_error::~runtime_error);
                                            }
                                            if (local_60.view_ != local_168.view_) {
                                              prVar9 = (runtime_error *)
                                                       __cxa_allocate_exception(0x10);
                                              std::runtime_error::runtime_error
                                                        (prVar9,"Assertion failed.");
                                              goto LAB_001d11ab;
                                            }
                                            if (local_168.index_ != local_60.index_)
                                            goto LAB_001d0ac6;
                                            if ((sVar2 == sVar1) &&
                                               (local_60.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0)) {
                                              operator_delete(local_60.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_60.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_60.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            if (local_1c8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_1c8.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            pIVar7 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_198);
                                            if ((pIVar7->view_ == (view_pointer)0x0) ||
                                               ((pIVar7->view_->geometry_).size_ <= pIVar7->index_))
                                            {
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar8,"Assertion failed."
                                                        );
LAB_001d0b5e:
                                              pcVar10 = std::runtime_error::~runtime_error;
                                              puVar12 = &std::runtime_error::typeinfo;
                                            }
                                            else {
                                              if (*pIVar7->pointer_ == 0x2e) {
                                                pIVar7 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_168);
                                                if ((pIVar7->view_ == (view_pointer)0x0) ||
                                                   ((pIVar7->view_->geometry_).size_ <=
                                                    pIVar7->index_)) {
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar8,
                                                             "Assertion failed.");
                                                  goto LAB_001d0b5e;
                                                }
                                                if (*pIVar7->pointer_ == 0x2e) {
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_90,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_90.view_;
                                                  local_1c8.pointer_ = local_90.pointer_;
                                                  local_1c8.index_ = local_90.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_90.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_90.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_90.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_90.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_90.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_90,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_90.view_;
                                                  local_1c8.pointer_ = local_90.pointer_;
                                                  local_1c8.index_ = local_90.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_90.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_90.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_90.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_90.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_90.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x18;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d00b4:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d00c2:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d00b4;
                                                    }
                                                    if (local_198.index_ != local_168.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d00c2;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_1c8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_130,local_100);
                                                  sVar2 = local_198.index_;
                                                  sVar1 = local_1c8.index_;
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    prVar9 = (runtime_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar9,"Assertion failed.");
LAB_001d11fe:
                                                    __cxa_throw(prVar9,&std::runtime_error::typeinfo
                                                                ,std::runtime_error::~runtime_error)
                                                    ;
                                                  }
                                                  if (local_1c8.view_ != local_198.view_) {
                                                    prVar9 = (runtime_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar9,"Assertion failed.");
                                                    goto LAB_001d11fe;
                                                  }
                                                  if (local_198.index_ != local_1c8.index_) {
LAB_001d0b74:
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_90,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,local_100);
                                                  if (local_168.view_ == (view_pointer)0x0) {
                                                    prVar9 = (runtime_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar9,"Assertion failed.");
LAB_001d124e:
                                                    __cxa_throw(prVar9,&std::runtime_error::typeinfo
                                                                ,std::runtime_error::~runtime_error)
                                                    ;
                                                  }
                                                  if (local_90.view_ !=
                                                      (view_pointer)local_168.view_) {
                                                    prVar9 = (runtime_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              (prVar9,"Assertion failed.");
                                                    goto LAB_001d124e;
                                                  }
                                                  if (local_168.index_ != local_90.index_)
                                                  goto LAB_001d0b74;
                                                  if ((sVar2 == sVar1) &&
                                                     (local_90.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0)) {
                                                    operator_delete(local_90.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_90.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_90.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar7 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_198);
                                                  if ((pIVar7->view_ == (view_pointer)0x0) ||
                                                     ((pIVar7->view_->geometry_).size_ <=
                                                      pIVar7->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0c0c:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if (*pIVar7->pointer_ == 0x2e) {
                                                      pIVar7 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_168);
                                                  if ((pIVar7->view_ == (view_pointer)0x0) ||
                                                     ((pIVar7->view_->geometry_).size_ <=
                                                      pIVar7->index_)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0c0c;
                                                  }
                                                  if (*pIVar7->pointer_ == 0x2e) {
                                                    if (local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  bVar5 = andres::
                                                  Iterator<int,true,std::allocator<unsigned_long>>::
                                                  operator!=((
                                                  Iterator<int,true,std::allocator<unsigned_long>> *
                                                  )&local_198,&local_168);
                                                  if (!bVar5) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  bVar5 = andres::
                                                  Iterator<int,true,std::allocator<unsigned_long>>::
                                                  operator!=((
                                                  Iterator<int,true,std::allocator<unsigned_long>> *
                                                  )&local_198,&local_168);
                                                  if (!bVar5) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  bVar5 = andres::
                                                  Iterator<int,true,std::allocator<unsigned_long>>::
                                                  operator!=((
                                                  Iterator<int,true,std::allocator<unsigned_long>> *
                                                  )&local_198,&local_168);
                                                  if (!bVar5) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d01c6:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d01d4:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d01c6;
                                                  }
                                                  if (local_168.index_ <= local_198.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d01d4;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0242:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d0250:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0242;
                                                  }
                                                  if (local_168.index_ <= local_198.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d0250;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d02be:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d02cc:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d02be;
                                                  }
                                                  if (local_168.index_ <= local_198.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d02cc;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d033a:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d0348:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d033a;
                                                  }
                                                  if (local_198.index_ <= local_168.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d0348;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d03b6:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d03c4:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d03b6;
                                                  }
                                                  if (local_198.index_ <= local_168.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d03c4;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0432:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d0440:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0432;
                                                  }
                                                  if (local_198.index_ <= local_168.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d0440;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d04fe:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0538:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d04fe;
                                                    }
                                                    if (local_168.index_ < local_198.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d0538;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d04a0:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d04da:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d04a0;
                                                  }
                                                  if (local_168.index_ < local_198.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d04da;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d05f6:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0630:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d05f6;
                                                    }
                                                    if (local_168.index_ < local_198.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d0630;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0598:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d05d2:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0598;
                                                  }
                                                  if (local_168.index_ < local_198.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d05d2;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d06ee:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0728:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d06ee;
                                                    }
                                                    if (local_168.index_ < local_198.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d0728;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0690:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d06ca:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0690;
                                                  }
                                                  if (local_168.index_ < local_198.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d06ca;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d07e6:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0820:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d07e6;
                                                    }
                                                    if (local_198.index_ < local_168.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d0820;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0788:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d07c2:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0788;
                                                  }
                                                  if (local_198.index_ < local_168.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d07c2;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1c8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_130,0);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d08de:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0918:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d08de;
                                                    }
                                                    if (local_198.index_ < local_168.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d0918;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0880:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d08ba:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0880;
                                                  }
                                                  if (local_198.index_ < local_168.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d08ba;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  } while (iVar11 != 0);
                                                  if (local_168.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  _Var6._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var6._M_current = 0x18;
                                                  local_130._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_130 + 8),_Var6,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var6._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_198
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_198.index_ = 0;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_198.view_ = (view_pointer)0x0;
                                                  local_198.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_198);
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_168.index_ = 0;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_168.view_ = (view_pointer)0x0;
                                                  local_168.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_168);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_198.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.view_ = local_1c8.view_;
                                                  local_198.pointer_ = local_1c8.pointer_;
                                                  local_198.index_ = local_1c8.index_;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_198.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_f0,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_130,0);
                                                  local_1c8.view_ = (view_pointer)local_f0.view_;
                                                  local_1c8.pointer_ = local_f0.pointer_;
                                                  local_1c8.index_ = local_f0.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(this_00,&local_f0.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1c8);
                                                  puVar4 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar3 = local_168.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.view_ = local_1c8.view_;
                                                  local_168.pointer_ = local_1c8.pointer_;
                                                  local_168.index_ = local_1c8.index_;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1c8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_168.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1c8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1c8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)puVar4 -
                                                                           (long)puVar3);
                                                  }
                                                  if (local_1c8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1c8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1c8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1c8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_f0.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_f0.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_f0.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_f0.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  iVar11 = 0x17;
                                                  do {
                                                    if (local_198.view_ == (view_pointer)0x0) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
LAB_001d09d6:
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0a10:
                                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                                    }
                                                    if (local_168.view_ != local_198.view_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar8,
                                                                 "Assertion failed.");
                                                      goto LAB_001d09d6;
                                                    }
                                                    if (local_198.index_ < local_168.index_) {
                                                      plVar8 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar8,"test failed.");
                                                      pcVar10 = std::logic_error::~logic_error;
                                                      puVar12 = &std::logic_error::typeinfo;
                                                      goto LAB_001d0a10;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_198);
                                                  if (local_198.view_ == (view_pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
LAB_001d0978:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar12 = &std::runtime_error::typeinfo;
LAB_001d09b2:
                                                    __cxa_throw(plVar8,puVar12,pcVar10);
                                                  }
                                                  if (local_168.view_ != local_198.view_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    goto LAB_001d0978;
                                                  }
                                                  if (local_198.index_ < local_168.index_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar12 = &std::logic_error::typeinfo;
                                                    goto LAB_001d09b2;
                                                  }
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_168);
                                                  iVar11 = iVar11 + -1;
                                                  if (iVar11 == 0) {
                                                    if (local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_168.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_168.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_168.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_198.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_198.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_198.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_198.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_120,local_108 * 0x18);
                                                  operator_delete(_Var6._M_current,8);
                                                  return;
                                                  }
                                                  } while( true );
                                                  }
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar12 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar8,puVar12,pcVar10);
                                                }
                                              }
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar8,"test failed.");
                                              pcVar10 = std::logic_error::~logic_error;
                                              puVar12 = &std::logic_error::typeinfo;
                                            }
                                            __cxa_throw(plVar8,puVar12,pcVar10);
                                          }
                                        }
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar8,"test failed.");
                                        pcVar10 = std::logic_error::~logic_error;
                                        puVar12 = &std::logic_error::typeinfo;
                                      }
                                      __cxa_throw(plVar8,puVar12,pcVar10);
                                    }
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                  }
                                  pcVar10 = std::runtime_error::~runtime_error;
                                  puVar12 = &std::runtime_error::typeinfo;
LAB_001d1076:
                                  __cxa_throw(plVar8,puVar12,pcVar10);
                                }
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar8,"Assertion failed.");
                              }
                              pcVar10 = std::runtime_error::~runtime_error;
                              puVar12 = &std::runtime_error::typeinfo;
LAB_001d0ffa:
                              __cxa_throw(plVar8,puVar12,pcVar10);
                            }
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                          }
                          pcVar10 = std::runtime_error::~runtime_error;
                          puVar12 = &std::runtime_error::typeinfo;
LAB_001d0f7e:
                          __cxa_throw(plVar8,puVar12,pcVar10);
                        }
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar8,"Assertion failed.");
                      }
                      pcVar10 = std::runtime_error::~runtime_error;
                      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0f02:
                      __cxa_throw(plVar8,puVar12,pcVar10);
                    }
                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  }
                  pcVar10 = std::runtime_error::~runtime_error;
                  puVar12 = &std::runtime_error::typeinfo;
LAB_001d0e86:
                  __cxa_throw(plVar8,puVar12,pcVar10);
                }
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
              pcVar10 = std::runtime_error::~runtime_error;
              puVar12 = &std::runtime_error::typeinfo;
LAB_001d0e0a:
              __cxa_throw(plVar8,puVar12,pcVar10);
            }
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          }
          pcVar10 = std::runtime_error::~runtime_error;
          puVar12 = &std::runtime_error::typeinfo;
LAB_001d0d8e:
          __cxa_throw(plVar8,puVar12,pcVar10);
        }
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      }
      pcVar10 = std::runtime_error::~runtime_error;
      puVar12 = &std::runtime_error::typeinfo;
LAB_001d0d12:
      __cxa_throw(plVar8,puVar12,pcVar10);
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  pcVar10 = std::runtime_error::~runtime_error;
  puVar12 = &std::runtime_error::typeinfo;
LAB_001d0c96:
  __cxa_throw(plVar8,puVar12,pcVar10);
}

Assistant:

void IteratorTest::comparisonOperators(){
    // operator-
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it1;
        }
        test((it1-it2)==24);
        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==0);
        
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            ++it2;
        }
        test((it1-it2)==-24);
    }
    // operator==
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it1==it2);
            ++it1;
            ++it2;
        }
        test(it1 == v.end() && it2 == v.end());
        test(*(--it1)==46 && *(--it2)==46);
    }
    //operator!=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1!=it2);
            ++it2;
        }
    }
    //operator<
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it2;
            test(it1<it2);
            ++it1;
        }
    }
    //operator>
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            ++it1;
            test(it1>it2);
            ++it2;
        }
    }
    //operator<=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1<=it2);
            ++it2;
            test(it1<=it2);
            ++it1;
        }
    }
    //operator>=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it1;
        andres::Iterator<int, constTarget> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it1;
        andres::Iterator<int, true> it2;
        it1 = v.begin();
        it2 = v.begin();

        for(int i = 0; i < 23; ++i){
            test(it1>=it2);
            ++it1;
            test(it1>=it2);
            ++it2;
        }
    }
}